

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x67,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
  }
  uVar3 = 0;
  memset(cctx,0,0x1478);
  (cctx->customMem).customAlloc = memManager.customAlloc;
  (cctx->customMem).customFree = memManager.customFree;
  (cctx->customMem).opaque = memManager.opaque;
  puVar1 = (uint *)cpuid_basic_info(0);
  if (6 < *puVar1) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar3 = *(uint *)(lVar2 + 4);
  }
  cctx->bmi2 = uVar3 >> 8 & uVar3 >> 3 & 1;
  if (cctx->streamStage != zcss_init) {
    __assert_fail("!ZSTD_isError(err)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x6c,"void ZSTD_initCCtx(ZSTD_CCtx *, ZSTD_customMem)");
  }
  ZSTD_clearAllDicts(cctx);
  (cctx->externalMatchCtx).seqBuffer = (ZSTD_Sequence *)0x0;
  (cctx->externalMatchCtx).seqBufferCapacity = 0;
  (cctx->externalMatchCtx).mState = (void *)0x0;
  (cctx->externalMatchCtx).mFinder = (ZSTD_sequenceProducer_F *)0x0;
  memset(&cctx->requestedParams,0,0xd0);
  (cctx->requestedParams).compressionLevel = 3;
  (cctx->requestedParams).fParams.contentSizeFlag = 1;
  return;
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    ZSTD_memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuSupportsBmi2();
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}